

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cc
# Opt level: O2

void io::uci::parsePosition(string *input,Board *pos)

{
  long lVar1;
  long lVar2;
  long lVar3;
  istream *piVar4;
  Move move;
  string moveString;
  istringstream ss;
  
  lVar1 = std::__cxx11::string::find((char *)input,0x12a572);
  lVar2 = std::__cxx11::string::find((char *)input,0x12f02f);
  lVar3 = std::__cxx11::string::find((char *)input,0x12f034);
  if (lVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,board::Board::DEFAULT_FEN,(allocator<char> *)&moveString);
    board::Board::parseFen(pos,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
LAB_001267a0:
    if (lVar3 == -1) goto LAB_00126853;
  }
  else {
    if (lVar2 == -1) goto LAB_001267a0;
    if (lVar3 == -1) {
      std::__cxx11::string::substr((ulong)&ss,(ulong)input);
      board::Board::parseFen(pos,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      goto LAB_00126853;
    }
    std::__cxx11::string::substr((ulong)&ss,(ulong)input);
    board::Board::parseFen(pos,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
  }
  move.value = 0;
  move.score = 0;
  std::__cxx11::string::substr((ulong)&moveString,(ulong)input);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&moveString,_S_in);
  std::__cxx11::string::~string((string *)&moveString);
  moveString._M_dataplus._M_p = (pointer)&moveString.field_2;
  moveString._M_string_length = 0;
  moveString.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::operator>>((istream *)&ss,(string *)&moveString);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    move = parseMove(&moveString,pos);
    board::makemove::move(&move,pos);
  }
  pos->ply = 0;
  std::__cxx11::string::~string((string *)&moveString);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
LAB_00126853:
  board::Board::print(pos);
  return;
}

Assistant:

void io::uci::parsePosition(const std::string& input, board::Board& pos)
{
    size_t indexStartpos = input.find("startpos");
    size_t indexFen = input.find("fen ");
    size_t indexMoves = input.find("moves ");
    if (indexStartpos == 0) {
        pos.parseFen(board::Board::DEFAULT_FEN);
    }
    else if (indexFen != std::string::npos) {
        if (indexMoves != std::string::npos) {
            pos.parseFen(input.substr(indexFen + 4));
        }
        else {
            pos.parseFen(input.substr(indexFen + 4, indexMoves - 5));
        }
    }
    if (indexMoves != std::string::npos) {
        board::Move move;
        std::istringstream ss(input.substr(indexMoves + 6));
        std::string moveString;
        while (ss >> moveString) {
            move = io::parseMove(moveString, pos);
            board::makemove::move(move, pos);
        }
        pos.resetPly();
    }
    pos.print();
}